

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

int __thiscall ON_Brep::AddEdgeCurve(ON_Brep *this,ON_Curve *pC)

{
  int iVar1;
  ON_Curve *local_18;
  
  iVar1 = -1;
  if (pC != (ON_Curve *)0x0) {
    local_18 = pC;
    iVar1 = (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pC);
    if (iVar1 != 3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                 ,0x742,"","ON_Brep::AddEdgeCurve() got a non-3d curve - changing dim to 3.");
      (*(local_18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(local_18,3);
      iVar1 = (*(local_18->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (iVar1 != 3) {
        return -1;
      }
    }
    iVar1 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
    ON_SimpleArray<ON_Curve_*>::Append(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,&local_18);
  }
  return iVar1;
}

Assistant:

int 
ON_Brep::AddEdgeCurve( ON_Curve* pC )
{
  int c3i = -1;
  if ( 0 != pC )
  {

    int dim = pC->Dimension();

    if ( dim != 3 )
    {
      // 7 April 2003 Dale Lear: (See comment in ON_Brep::AddTrimCurve().)
      ON_ERROR("ON_Brep::AddEdgeCurve() got a non-3d curve - changing dim to 3.");
      pC->ChangeDimension(3);
      dim = pC->Dimension();
    }
    
    if ( 3 == dim )
    {
      c3i = m_C3.Count();
      m_C3.Append(pC);
    }
  }
  return c3i;
}